

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O3

bool __thiscall libtorrent::dht::traversal_algorithm::add_requests(traversal_algorithm *this)

{
  byte bVar1;
  uint uVar2;
  session_settings *psVar3;
  _WordT _Var4;
  uint *puVar5;
  node_id *n2;
  observer *this_00;
  dht_observer *pdVar6;
  pointer psVar7;
  undefined8 uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar10;
  undefined7 uVar12;
  char *pcVar11;
  address *addr;
  int iVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  span<const_char> in;
  undefined8 local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [16];
  __native_type local_a8;
  ulong local_80;
  ulong local_78;
  string local_70;
  aux local_50 [32];
  
  bVar17 = true;
  if (this->m_done == false) {
    iVar13 = (this->m_node->m_table).m_bucket_size;
    psVar3 = this->m_node->m_settings;
    local_b8._0_8_ = &psVar3->m_mutex;
    local_b8[8] = false;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
    local_b8[8] = true;
    _Var4 = (psVar3->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
    puVar5 = (uint *)(this->m_results).
                     super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    n2 = (node_id *)
         (this->m_results).
         super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar13 < 1 || (node_id *)puVar5 == n2) {
      bVar16 = true;
    }
    else {
      pcVar11 = (char *)&this->m_target;
      lVar15 = -(long)puVar5;
      uVar14 = 0;
      local_a8._16_8_ = pcVar11;
      do {
        if (((uint)_Var4 >> 9 & 1) == 0) {
          uVar10 = CONCAT71((int7)((ulong)pcVar11 >> 8),this->m_invoke_count);
          if (this->m_branch_factor <= this->m_invoke_count) goto LAB_003cb4aa;
        }
        else {
          uVar10 = (ulong)(uint)(int)this->m_branch_factor;
          if ((int)this->m_branch_factor <= (int)uVar14) goto LAB_003cb4aa;
        }
        this_00 = *(observer **)puVar5;
        bVar1 = (this_00->flags).m_val;
        uVar12 = (undefined7)(uVar10 >> 8);
        pcVar11 = (char *)CONCAT71(uVar12,bVar1);
        if ((bVar1 & 0x40) == 0) {
          if ((bVar1 & 1) == 0) {
            pdVar6 = this->m_node->m_observer;
            if ((pdVar6 != (dht_observer *)0x0) &&
               (iVar9 = (**(pdVar6->super_dht_logger)._vptr_dht_logger)(pdVar6,4),
               (char)iVar9 != '\0')) {
              uVar2 = this->m_id;
              psVar7 = (this->m_results).
                       super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_78 = (ulong)(uint)(int)this->m_invoke_count;
              local_80 = (ulong)(uint)(int)this->m_branch_factor;
              iVar9 = distance_exp((dht *)local_a8._16_8_,&this_00->m_id,n2);
              local_a8.__data.__list.__next =
                   (__pthread_internal_list *)CONCAT44(extraout_var,iVar9);
              in.m_len = (difference_type)pcVar11;
              in.m_ptr = (char *)0x14;
              aux::to_hex_abi_cxx11_((string *)local_b8,(aux *)&this_00->m_id,in);
              uVar8 = local_b8._0_8_;
              observer::target_addr(this_00);
              aux::print_address_abi_cxx11_(&local_70,local_50,addr);
              local_a8.__data.__list.__prev = (__pthread_internal_list *)local_70._M_dataplus._M_p;
              iVar9 = (*this->_vptr_traversal_algorithm[2])(this);
              pcVar11 = (char *)(ulong)uVar2;
              (*(pdVar6->super_dht_logger)._vptr_dht_logger[1])
                        (pdVar6,4,
                         "[%u] INVOKE nodes-left: %d top-invoke-count: %d invoke-count: %d branch-factor: %d distance: %d id: %s addr: %s type: %s"
                         ,pcVar11,(ulong)((long)&(psVar7->
                                                 super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                                                 )._M_ptr + lVar15) >> 4 & 0xffffffff,(ulong)uVar14,
                         local_78,local_80,local_a8.__data.__list.__next,uVar8,
                         local_a8.__data.__list.__prev,CONCAT44(extraout_var_00,iVar9));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              if ((__native_type *)local_b8._0_8_ != &local_a8) {
                operator_delete((void *)local_b8._0_8_,local_a8.__align + 1);
              }
            }
            if (this->m_abort == false) {
              (this_00->flags).m_val = (this_00->flags).m_val | 1;
              local_c8 = *(undefined8 *)puVar5;
              local_c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar5 + 2);
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                pcVar11 = &__libc_single_threaded;
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  local_c0->_M_use_count = local_c0->_M_use_count + 1;
                }
              }
              iVar9 = (*this->_vptr_traversal_algorithm[6])(this,&local_c8);
              if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
              }
              if ((char)iVar9 == '\0') {
                (this_00->flags).m_val = (this_00->flags).m_val | 0x10;
              }
              else {
                this->m_invoke_count = this->m_invoke_count + '\x01';
                uVar14 = uVar14 + 1;
              }
            }
          }
          else {
            pcVar11 = (char *)(CONCAT71(uVar12,bVar1) & 0xffffffffffffff10);
            uVar14 = uVar14 + ((char)pcVar11 == '\0');
          }
        }
        else {
          iVar13 = iVar13 + -1;
        }
      } while (((node_id *)(puVar5 + 4) != n2) &&
              (lVar15 = lVar15 + -0x10, puVar5 = puVar5 + 4, iVar13 != 0));
      bVar16 = uVar14 == 0;
    }
    bVar17 = true;
    if ((iVar13 != 0) || (!bVar16)) {
LAB_003cb4aa:
      bVar17 = this->m_invoke_count == '\0';
    }
  }
  return bVar17;
}

Assistant:

bool traversal_algorithm::add_requests()
{
	INVARIANT_CHECK;
	if (m_done) return true;

	int results_target = m_node.m_table.bucket_size();

	// this only counts outstanding requests at the top of the
	// target list. This is <= m_invoke count. m_invoke_count
	// is the total number of outstanding requests, including
	// old ones that may be waiting on nodes much farther behind
	// the current point we've reached in the search.
	int outstanding = 0;

	// if we're doing aggressive lookups, we keep branch-factor
	// outstanding requests _at the tops_ of the result list. Otherwise
	// we just keep any branch-factor outstanding requests
	bool const agg = m_node.settings().get_bool(settings_pack::dht_aggressive_lookups);

	// Find the first node that hasn't already been queried.
	// and make sure that the 'm_branch_factor' top nodes
	// stay queried at all times (obviously ignoring failed nodes)
	// and without surpassing the 'result_target' nodes (i.e. k=8)
	// this is a slight variation of the original paper which instead
	// limits the number of outstanding requests, this limits the
	// number of good outstanding requests. It will use more traffic,
	// but is intended to speed up lookups
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end
		&& results_target > 0
		&& (agg ? outstanding < m_branch_factor
			: m_invoke_count < m_branch_factor);
		++i)
	{
		observer* o = i->get();
		if (o->flags & observer::flag_alive)
		{
			TORRENT_ASSERT(o->flags & observer::flag_queried);
			--results_target;
			continue;
		}
		if (o->flags & observer::flag_queried)
		{
			// if it's queried, not alive and not failed, it
			// must be currently in flight
			if (!(o->flags & observer::flag_failed))
				++outstanding;

			continue;
		}

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] INVOKE nodes-left: %d top-invoke-count: %d "
				"invoke-count: %d branch-factor: %d "
				"distance: %d id: %s addr: %s type: %s"
				, m_id, int(m_results.end() - i), outstanding, int(m_invoke_count)
				, int(m_branch_factor), distance_exp(m_target, o->id()), aux::to_hex(o->id()).c_str()
				, aux::print_address(o->target_addr()).c_str(), name());
		}
#endif

		// we're shutting down, don't issue any more lookups
		if (m_abort) continue;

		TORRENT_ASSERT(!(o->flags & observer::flag_queried));
		o->flags |= observer::flag_queried;
		if (invoke(*i))
		{
			TORRENT_ASSERT(m_invoke_count < std::numeric_limits<std::int8_t>::max());
			++m_invoke_count;
			++outstanding;
		}
		else
		{
			o->flags |= observer::flag_failed;
		}
	}

	// this is the completion condition. If we found m_node.m_table.bucket_size()
	// (i.e. k=8) completed results, without finding any still
	// outstanding requests, we're done.
	// also, if invoke count is 0, it means we didn't even find 'k'
	// working nodes, we still have to terminate though.
	return (results_target == 0 && outstanding == 0) || m_invoke_count == 0;
}